

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resizeResolveLabel(Parse *p,Vdbe *v,int j)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  sqlite3 *in_RSI;
  long in_RDI;
  int nNewSize;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = 10 - *(int *)(in_RDI + 0x48);
  pvVar2 = sqlite3DbReallocOrFree
                     (in_RSI,(void *)CONCAT44(in_EDX,iVar1),
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(void **)(in_RDI + 0x50) = pvVar2;
  if (*(long *)(in_RDI + 0x50) == 0) {
    *(undefined4 *)(in_RDI + 0x4c) = 0;
  }
  else {
    if ((99 < iVar1) && (*(int *)(in_RDI + 0x4c) / 100 < iVar1 / 100)) {
      sqlite3ProgressCheck((Parse *)CONCAT44(iVar1 / 100,in_stack_ffffffffffffffe0));
    }
    *(int *)(in_RDI + 0x4c) = iVar1;
    *(int *)(*(long *)(in_RDI + 0x50) + (long)in_EDX * 4) = in_RSI->aLimit[2];
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void resizeResolveLabel(Parse *p, Vdbe *v, int j){
  int nNewSize = 10 - p->nLabel;
  p->aLabel = sqlite3DbReallocOrFree(p->db, p->aLabel,
                     nNewSize*sizeof(p->aLabel[0]));
  if( p->aLabel==0 ){
    p->nLabelAlloc = 0;
  }else{
#ifdef SQLITE_DEBUG
    int i;
    for(i=p->nLabelAlloc; i<nNewSize; i++) p->aLabel[i] = -1;
#endif
    if( nNewSize>=100 && (nNewSize/100)>(p->nLabelAlloc/100) ){
      sqlite3ProgressCheck(p);
    }
    p->nLabelAlloc = nNewSize;
    p->aLabel[j] = v->nOp;
  }
}